

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
ObjNoTest_UseFirstObjByDefault_Test::TestBody(ObjNoTest_UseFirstObjByDefault_Test *this)

{
  bool bVar1;
  TestSolver *this_00;
  char *file;
  SolverApp<TestSolver,_TestNLReader> *pSVar2;
  AssertionResult gtest_ar;
  SolverApp<TestSolver,_TestNLReader> app;
  char *in_stack_fffffffffffffa88;
  int nl_reader_flags;
  SolverApp<TestSolver,_TestNLReader> *in_stack_fffffffffffffa90;
  int *in_stack_fffffffffffffa98;
  Args *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  int line;
  char *in_stack_fffffffffffffac8;
  Args *in_stack_fffffffffffffad0;
  char *in_stack_fffffffffffffae0;
  SolverApp<TestSolver,_TestNLReader> *in_stack_fffffffffffffaf0;
  Message *in_stack_fffffffffffffb08;
  AssertHelper *in_stack_fffffffffffffb10;
  AssertionResult local_4c8;
  SolverApp<TestSolver,_TestNLReader> local_4b8;
  
  pSVar2 = &local_4b8;
  mp::SolverApp<TestSolver,_TestNLReader>::SolverApp(in_stack_fffffffffffffaf0);
  this_00 = mp::SolverApp<TestSolver,_TestNLReader>::solver(pSVar2);
  file = (char *)mp::SolverOptionManager::GetIntOption
                           ((SolverOptionManager *)in_stack_fffffffffffffa90,
                            in_stack_fffffffffffffa88);
  testing::internal::EqHelper<false>::Compare<int,long_long>
            ((char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
             (char *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
             (longlong *)in_stack_fffffffffffffa90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffaac);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffaa0 =
         (Args *)testing::AssertionResult::failure_message((AssertionResult *)0x158623);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)pSVar2 >> 0x20),file,line,
               (char *)in_stack_fffffffffffffaa0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa90);
    testing::Message::~Message((Message *)0x158680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1586d8);
  nl_reader_flags = 0;
  Args::Args(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,(char *)this_00,(char *)pSVar2,file
             ,(char *)CONCAT44(line,in_stack_fffffffffffffaa8),in_stack_fffffffffffffae0);
  pSVar2 = (SolverApp<TestSolver,_TestNLReader> *)
           Args::operator_cast_to_char___(in_stack_fffffffffffffaa0);
  mp::SolverApp<TestSolver,_TestNLReader>::Run
            (pSVar2,(char **)in_stack_fffffffffffffa90,nl_reader_flags);
  Args::~Args((Args *)in_stack_fffffffffffffa90);
  mp::SolverApp<TestSolver,_TestNLReader>::~SolverApp(in_stack_fffffffffffffa90);
  return;
}

Assistant:

TEST(ObjNoTest, UseFirstObjByDefault) {
  mp::SolverApp<TestSolver, TestNLReader> app;
  EXPECT_EQ(1, app.solver().GetIntOption("objno"));
  app.Run(Args("test", "testproblem"));
}